

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

wchar_t read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  byte bVar2;
  mtree *mtree;
  bool bVar3;
  __mode_t p;
  wchar_t wVar4;
  wchar_t wVar5;
  mode_t mVar6;
  int iVar7;
  mtree_entry *pmVar8;
  int *piVar9;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar10;
  archive_string *paVar11;
  ushort **ppuVar12;
  size_t sVar13;
  mtree_entry **ppmVar14;
  archive_rb_node *paVar15;
  archive_rb_node *paVar16;
  size_t len;
  mtree_entry *pmVar17;
  ulong uVar18;
  la_int64_t lVar19;
  char *pcVar20;
  mtree_entry *pmVar21;
  char *pcVar22;
  size_t sVar23;
  __dev_t _Var24;
  ulong uVar25;
  archive_entry *rbt;
  char *pcVar26;
  mtree_option **global_00;
  char cVar27;
  uint uVar28;
  byte *pbVar29;
  long lVar30;
  undefined1 *puVar31;
  mtree_entry *pmVar32;
  mtree_entry *pmVar33;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  long local_120;
  archive_entry *local_118;
  wchar_t local_10c;
  mtree_entry *local_108;
  mtree_entry *local_100;
  mtree_entry *local_f8;
  archive_entry *local_f0;
  ulong local_e8;
  mtree_entry *local_e0;
  archive_rb_tree *local_d8;
  archive_entry *local_d0;
  mtree_entry **local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (L'\xffffffff' < mtree->fd) {
    close(mtree->fd);
    mtree->fd = L'\xffffffff';
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      uVar25 = 0xffffffe2;
      goto LAB_00245e0e;
    }
    local_f0 = entry;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = L'\x00080000';
    mtree->archive_format_name = "mtree";
    local_118 = (archive_entry *)0x0;
    detect_form(a,(wchar_t *)&local_d0);
    local_120 = 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = &mtree->entries;
      local_d8 = &mtree->rbtree;
      local_f8 = (mtree_entry *)0x0;
LAB_00245600:
      lVar30 = 0;
      uVar18 = 0;
      do {
        _Var24 = local_c0.st_dev;
        if ((long)local_c0.st_dev < 0) goto LAB_00245dfb;
        pvVar10 = memchr(__s,10,local_c0.st_dev);
        if (pvVar10 != (void *)0x0) {
          _Var24 = (long)pvVar10 + (1 - (long)__s);
          local_c0.st_dev = _Var24;
        }
        if (0xffff < (long)(_Var24 + uVar18)) {
          pcVar20 = "Line too long";
          iVar7 = 0x54;
          goto LAB_00245df4;
        }
        paVar11 = archive_string_ensure((archive_string *)mtree,_Var24 + uVar18 + 1);
        if (paVar11 == (archive_string *)0x0) {
          pcVar20 = "Can\'t allocate working buffer";
          iVar7 = 0xc;
          goto LAB_00245df4;
        }
        memcpy((mtree->line).s + uVar18,__s,local_c0.st_dev);
        __archive_read_consume(a,local_c0.st_dev);
        uVar25 = local_c0.st_dev + uVar18;
        (mtree->line).s[uVar25] = '\0';
        pmVar8 = (mtree_entry *)(mtree->line).s;
        pbVar29 = (byte *)((long)(pmVar8->rbnode).rb_nodes + lVar30);
LAB_00245699:
        bVar1 = *pbVar29;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar10 == (void *)0x0) goto LAB_002456d7;
          }
          else {
            if (bVar1 == 0) goto LAB_002456d7;
            if (bVar1 == 10) {
              if (uVar25 == 0) break;
              if (-1 < (long)uVar25) {
                lVar30 = 0;
                pmVar32 = pmVar8;
                goto LAB_00245730;
              }
              free_options((mtree_option *)local_118);
              entry = local_f0;
              if ((int)uVar25 != 0) goto LAB_00245e0e;
              goto LAB_002451a1;
            }
          }
LAB_002456cf:
          pbVar29 = pbVar29 + 1;
          goto LAB_00245699;
        }
        if ((bVar1 != 0x5c) || (pbVar29[1] == 0)) goto LAB_002456cf;
        if (pbVar29[1] != 10) {
          pbVar29 = pbVar29 + 1;
          goto LAB_002456cf;
        }
        *(char *)((long)(pmVar8->rbnode).rb_nodes + (uVar25 - 2)) = '\0';
        uVar25 = uVar25 - 2;
        pmVar8 = (mtree_entry *)(mtree->line).s;
LAB_002456d7:
        lVar30 = (long)pbVar29 - (long)pmVar8;
        __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
        uVar18 = uVar25;
      } while (__s != (void *)0x0);
    }
LAB_00245c37:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_118);
    entry = local_f0;
  }
LAB_002451a1:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar8 = mtree->this_entry;
  uVar25 = 1;
  if (pmVar8 != (mtree_entry *)0x0) {
    paVar11 = &mtree->current_dir;
    rbt = (archive_entry *)&mtree->rbtree;
    local_f0 = rbt;
    do {
      pcVar20 = pmVar8->name;
      if (((*pcVar20 == '.') && (pcVar20[1] == '.')) && (pcVar20[2] == '\0')) {
        pmVar8->used = '\x01';
        sVar23 = (mtree->current_dir).length;
        if (sVar23 != 0) {
          pcVar20 = paVar11->s;
          pcVar22 = pcVar20 + sVar23;
          do {
            pcVar26 = pcVar22;
            pcVar22 = pcVar26 + -1;
            if (pcVar22 < pcVar20) break;
          } while (*pcVar22 != '/');
          pcVar26 = pcVar26 + -2;
          if (pcVar22 < pcVar20) {
            pcVar26 = pcVar22;
          }
          (mtree->current_dir).length = (size_t)(pcVar26 + (1 - (long)pcVar20));
        }
      }
      else if (pmVar8->used == '\0') {
        pmVar8->used = '\x01';
        local_118 = entry;
        archive_entry_set_filetype(entry,0x8000);
        archive_entry_set_size(entry,0);
        (mtree->contents_name).length = 0;
        local_10c = L'\0';
        wVar4 = parse_line(a,entry,mtree,pmVar8,&local_10c);
        if (pmVar8->full == '\0') {
          sVar23 = (mtree->current_dir).length;
          if (sVar23 != 0) {
            archive_strcat(paVar11,"/");
          }
          archive_strcat(paVar11,pmVar8->name);
          archive_entry_copy_pathname(entry,paVar11->s);
          mVar6 = archive_entry_filetype(entry);
          rbt = local_f0;
          if (mVar6 != 0x4000) {
            (mtree->current_dir).length = sVar23;
          }
        }
        else {
          archive_entry_copy_pathname(entry,pmVar8->name);
          for (pmVar8 = (mtree_entry *)
                        __archive_rb_tree_find_node((archive_rb_tree *)rbt,pmVar8->name);
              pmVar8 != (mtree_entry *)0x0; pmVar8 = pmVar8->next_dup) {
            if ((pmVar8->full != '\0') && (pmVar8->used == '\0')) {
              pmVar8->used = '\x01';
              wVar5 = parse_line(a,entry,mtree,pmVar8,&local_10c);
              if (wVar5 < wVar4) {
                wVar4 = wVar5;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_00245d8a:
          lVar19 = archive_entry_size(entry);
          mtree->cur_size = lVar19;
          mtree->offset = 0;
        }
        else {
          mtree->fd = L'\xffffffff';
          if ((mtree->contents_name).length == 0) {
            pcVar20 = archive_entry_pathname(entry);
          }
          else {
            pcVar20 = (mtree->contents_name).s;
          }
          mVar6 = archive_entry_filetype(entry);
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 == 0x4000)) {
            wVar5 = open(pcVar20,0x80000);
            mtree->fd = wVar5;
            __archive_ensure_cloexec_flag(wVar5);
            wVar5 = mtree->fd;
            if (wVar5 == L'\xffffffff') {
              piVar9 = __errno_location();
              if ((*piVar9 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar9,"Can\'t open %s",pcVar20);
                wVar4 = L'\xffffffec';
              }
              goto LAB_0024539a;
            }
          }
          else {
LAB_0024539a:
            wVar5 = mtree->fd;
          }
          if (wVar5 < L'\0') {
            iVar7 = lstat(pcVar20,&local_c0);
            if (iVar7 != -1) goto LAB_002453f3;
LAB_0024542b:
            if ((local_10c & 0x800U) == 0) goto LAB_00245d8a;
LAB_00245546:
            pmVar8 = mtree->this_entry;
            goto LAB_0024554f;
          }
          iVar7 = fstat(wVar5,&local_c0);
          if (iVar7 == -1) {
            piVar9 = __errno_location();
            archive_set_error(&a->archive,*piVar9,"Could not fstat %s",pcVar20);
            close(mtree->fd);
            mtree->fd = L'\xffffffff';
            wVar4 = L'\xffffffec';
            goto LAB_0024542b;
          }
LAB_002453f3:
          p = local_c0.st_mode;
          uVar28 = local_c0.st_mode & 0xf000;
          if (uVar28 == 0xa000) {
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 != 0xa000) goto LAB_00245495;
LAB_00245c57:
            wVar5 = local_10c;
            if (((local_10c & 0x1001U) != 1) &&
               ((mVar6 = archive_entry_filetype(entry), mVar6 == 0x2000 ||
                (mVar6 = archive_entry_filetype(entry), mVar6 == 0x6000)))) {
              archive_entry_set_rdev(entry,local_c0.st_rdev);
            }
            if ((wVar5 & 0xcU) == 0 || ((uint)wVar5 >> 0xc & 1) != 0) {
              archive_entry_set_gid(entry,(ulong)local_c0.st_gid);
            }
            if ((wVar5 & 0x600U) == 0 || ((uint)wVar5 >> 0xc & 1) != 0) {
              archive_entry_set_uid(entry,(ulong)local_c0.st_uid);
            }
            if ((wVar5 & 0x1010U) != 0x10) {
              archive_entry_set_mtime(entry,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
            }
            if ((wVar5 & 0x1020U) != 0x20) {
              archive_entry_set_nlink(entry,(uint)local_c0.st_nlink);
            }
            if ((wVar5 & 0x1040U) != 0x40) {
              archive_entry_set_perm(entry,p);
            }
            if ((wVar5 & 0x1080U) != 0x80) {
              archive_entry_set_size(entry,local_c0.st_size);
            }
            archive_entry_set_ino(entry,local_c0.st_ino);
            archive_entry_set_dev(entry,local_c0.st_dev);
            archive_entry_linkify(mtree->resolver,&local_118,&local_d0);
            entry = local_118;
            goto LAB_00245d8a;
          }
          if ((uVar28 == 0x8000) && (mVar6 = archive_entry_filetype(entry), mVar6 == 0x8000))
          goto LAB_00245c57;
LAB_00245495:
          if (((~p & 0xc000) == 0) && (mVar6 = archive_entry_filetype(entry), mVar6 == 0xc000))
          goto LAB_00245c57;
          switch(uVar28 - 0x1000 >> 0xc) {
          case 0:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x1000) goto LAB_00245c57;
            break;
          case 1:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x2000) goto LAB_00245c57;
            break;
          case 3:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x4000) goto LAB_00245c57;
            break;
          case 5:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x6000) goto LAB_00245c57;
          }
          if (L'\xffffffff' < mtree->fd) {
            close(mtree->fd);
          }
          mtree->fd = L'\xffffffff';
          if ((local_10c & 0x800U) != 0) goto LAB_00245546;
          if (wVar4 == L'\0') {
            pcVar20 = archive_entry_pathname(entry);
            archive_set_error(&a->archive,-1,"mtree specification has different type for %s",pcVar20
                             );
            wVar4 = L'\xffffffec';
          }
        }
        uVar25 = (ulong)(uint)wVar4;
        goto LAB_00245e0e;
      }
LAB_0024554f:
      pmVar8 = pmVar8->next;
      mtree->this_entry = pmVar8;
    } while (pmVar8 != (mtree_entry *)0x0);
    uVar25 = 1;
  }
LAB_00245e0e:
  return (wchar_t)uVar25;
LAB_00245730:
  pmVar32 = (mtree_entry *)((long)(pmVar32->rbnode).rb_nodes + 1);
  bVar1 = *(byte *)((long)(pmVar8->rbnode).rb_nodes + lVar30);
  uVar25 = (ulong)bVar1;
  if (0x23 < uVar25) goto LAB_0024578b;
  if ((0x100000200U >> (uVar25 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar25 & 0x3f) & 1) != 0) goto LAB_0024575f;
    goto LAB_0024578b;
  }
  lVar30 = lVar30 + 1;
  goto LAB_00245730;
LAB_0024578b:
  pmVar17 = (mtree_entry *)((long)(pmVar8->rbnode).rb_nodes + lVar30);
  uVar25 = (local_c0.st_dev + uVar18) - lVar30;
  pmVar33 = (mtree_entry *)((long)pmVar17 + (uVar25 - 1));
  if (pmVar17 < pmVar33) {
    local_100 = pmVar17;
    local_e8 = uVar25;
    ppuVar12 = __ctype_b_loc();
    pmVar21 = local_100;
    do {
      bVar2 = *(byte *)(pmVar21->rbnode).rb_nodes;
      if ((bVar2 != 9) && (((*ppuVar12)[bVar2] & 0x4000) == 0)) goto LAB_00245e23;
      pmVar21 = (mtree_entry *)((long)(pmVar21->rbnode).rb_nodes + 1);
      uVar25 = local_e8;
      pmVar17 = local_100;
    } while (pmVar21 < pmVar33);
  }
  wVar4 = (wchar_t)local_d0;
  if (bVar1 != 0x2f) {
    local_100 = pmVar17;
    local_e8 = uVar25;
    local_e0 = (mtree_entry *)malloc(0x40);
    if (local_e0 != (mtree_entry *)0x0) {
      *(undefined8 *)((long)&local_e0->options + 2) = 0;
      *(undefined8 *)((long)&local_e0->name + 2) = 0;
      local_e0->next = (mtree_entry *)0x0;
      local_e0->options = (mtree_option *)0x0;
      ppmVar14 = &local_f8->next;
      if (local_f8 == (mtree_entry *)0x0) {
        ppmVar14 = local_c8;
      }
      *ppmVar14 = local_e0;
      local_108 = local_e0;
      if (wVar4 != L'\0') {
        uVar25 = local_e8;
        local_f8 = local_100;
        if (0 < (long)local_e8) {
LAB_00245997:
          uVar18 = (ulong)*(byte *)(pmVar33->rbnode).rb_nodes;
          if ((uVar18 < 0x21) && ((0x100002600U >> (uVar18 & 0x3f) & 1) != 0))
          goto code_r0x002459af;
          uVar18 = 0;
          do {
            if (((ulong)(byte)pmVar32[-1].field_0x3f < 0x21) &&
               ((0x100002600U >> ((ulong)(byte)pmVar32[-1].field_0x3f & 0x3f) & 1) != 0)) {
              local_f8 = pmVar32;
            }
            uVar18 = uVar18 + 1;
            pmVar32 = (mtree_entry *)((long)(pmVar32->rbnode).rb_nodes + 1);
          } while (uVar25 != uVar18);
        }
        goto LAB_002459c9;
      }
      pcVar20 = (char *)strcspn((char *)local_100," \t\r\n");
      pmVar8 = (mtree_entry *)(pcVar20 + (long)((long)(pmVar8->rbnode).rb_nodes + lVar30));
      local_f8 = (mtree_entry *)((long)(pmVar8->rbnode).rb_nodes + local_e8);
      goto LAB_00245aac;
    }
    goto LAB_00245e63;
  }
  if (4 < (long)uVar25) {
    iVar7 = strncmp((char *)pmVar17,"/set",4);
    if (iVar7 == 0) {
      cVar27 = *(char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + 4);
      if ((cVar27 == ' ') || (cVar27 == '\t')) {
        pcVar20 = (char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + 4);
        while (sVar13 = strspn(pcVar20," \t\r\n"), pcVar20[sVar13] != '\0') {
          pcVar26 = pcVar20 + sVar13;
          sVar13 = strcspn(pcVar26," \t\r\n");
          pcVar20 = pcVar26 + sVar13;
          pcVar22 = strchr(pcVar26,0x3d);
          sVar23 = (long)pcVar22 - (long)pcVar26;
          if (pcVar20 < pcVar22) {
            sVar23 = sVar13;
          }
          remove_option((mtree_option **)&local_118,pcVar26,sVar23);
          wVar4 = add_option(a,(mtree_option **)&local_118,pcVar26,sVar13);
          uVar25 = (ulong)(uint)wVar4;
          if (wVar4 != L'\0') goto LAB_00245e01;
        }
        goto LAB_0024575f;
      }
      goto LAB_00245e23;
    }
    if (((uVar25 < 7) || (iVar7 = strncmp((char *)pmVar17,"/unset",6), iVar7 != 0)) ||
       ((cVar27 = *(char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + 6), cVar27 != ' ' &&
        (cVar27 != '\t')))) goto LAB_00245e23;
    pcVar22 = (char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + 6);
    pcVar20 = strchr(pcVar22,0x3d);
    if (pcVar20 == (char *)0x0) {
      sVar13 = strspn(pcVar22," \t\r\n");
      cVar27 = *(char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + 6 + sVar13);
      if (cVar27 != '\0') {
        pcVar20 = (char *)((long)(pmVar8->rbnode).rb_nodes + lVar30 + sVar13 + 6);
        do {
          sVar13 = strcspn(pcVar20," \t\r\n");
          sVar23 = sVar13;
          if (sVar13 == 3) {
            if (((cVar27 != 'a') || (pcVar20[1] != 'l')) || (pcVar20[2] != 'l')) {
              sVar23 = 3;
              goto LAB_00245900;
            }
            free_options((mtree_option *)local_118);
            local_118 = (archive_entry *)0x0;
          }
          else {
LAB_00245900:
            remove_option((mtree_option **)&local_118,pcVar20,sVar23);
          }
          pcVar20 = pcVar20 + sVar13;
          sVar13 = strspn(pcVar20," \t\r\n");
          cVar27 = pcVar20[sVar13];
          pcVar20 = pcVar20 + sVar13;
        } while (cVar27 != '\0');
      }
      goto LAB_0024575f;
    }
    pcVar20 = "/unset shall not contain `=\'";
    iVar7 = -1;
    goto LAB_00245df4;
  }
LAB_00245e23:
  archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_120);
LAB_00245dfb:
  uVar25 = 0xffffffe2;
LAB_00245e01:
  free_options((mtree_option *)local_118);
  goto LAB_00245e0e;
code_r0x002459af:
  pmVar33 = (mtree_entry *)&pmVar33[-1].field_0x3f;
  bVar3 = (long)uVar25 < 2;
  uVar25 = uVar25 - 1;
  if (bVar3) goto code_r0x002459bf;
  goto LAB_00245997;
code_r0x002459bf:
  uVar25 = 0;
LAB_002459c9:
  pcVar20 = (char *)((long)pmVar8 + lVar30 + (uVar25 - (long)local_f8));
  pmVar8 = local_100;
  local_100 = local_f8;
LAB_00245aac:
  pmVar32 = local_108;
  pcVar22 = (char *)malloc((size_t)(pcVar20 + 1));
  pmVar32->name = pcVar22;
  if (pcVar22 != (char *)0x0) {
    memcpy(pcVar22,local_100,(size_t)pcVar20);
    pcVar22[(long)pcVar20] = '\0';
    parse_escapes(pcVar22,pmVar32);
    pmVar17 = local_e0;
    pmVar32->next_dup = (mtree_entry *)0x0;
    if (((pmVar32->full != '\0') &&
        (iVar7 = __archive_rb_tree_insert_node(local_d8,&pmVar32->rbnode), iVar7 == 0)) &&
       (paVar15 = __archive_rb_tree_find_node(local_d8,pmVar32->name),
       paVar15 != (archive_rb_node *)0x0)) {
      do {
        paVar16 = paVar15;
        paVar15 = paVar16[1].rb_nodes[0];
      } while (paVar15 != (archive_rb_node *)0x0);
      paVar16[1].rb_nodes[0] = &pmVar32->rbnode;
    }
    global_00 = &pmVar17->options;
    puVar31 = (undefined1 *)&local_118;
    while (puVar31 = *(undefined1 **)puVar31, puVar31 != (undefined1 *)0x0) {
      pcVar20 = *(char **)((long)puVar31 + 8);
      sVar13 = strlen(pcVar20);
      wVar4 = add_option(a,global_00,pcVar20,sVar13);
      if (wVar4 != L'\0') goto LAB_00245e41;
    }
    while ((sVar13 = strspn((char *)pmVar8," \t\r\n"),
           *(char *)((long)(pmVar8->rbnode).rb_nodes + sVar13) != '\0' &&
           (pmVar32 = (mtree_entry *)((long)(pmVar8->rbnode).rb_nodes + sVar13), pmVar32 < local_f8)
           )) {
      len = strcspn((char *)pmVar32," \t\r\n");
      pmVar8 = (mtree_entry *)((long)(pmVar32->rbnode).rb_nodes + len);
      pmVar17 = (mtree_entry *)strchr((char *)pmVar32,0x3d);
      sVar13 = (long)pmVar17 - (long)pmVar32;
      if (pmVar8 < pmVar17) {
        sVar13 = len;
      }
      if (pmVar17 == (mtree_entry *)0x0) {
        sVar13 = len;
      }
      remove_option(global_00,(char *)pmVar32,sVar13);
      wVar4 = add_option(a,global_00,(char *)pmVar32,len);
      if (wVar4 != L'\0') goto LAB_00245e41;
    }
    local_f8 = local_108;
LAB_0024575f:
    local_120 = local_120 + 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s == (void *)0x0) goto LAB_00245c37;
    goto LAB_00245600;
  }
LAB_00245e63:
  piVar9 = __errno_location();
  iVar7 = *piVar9;
  pcVar20 = "Can\'t allocate memory";
LAB_00245df4:
  archive_set_error(&a->archive,iVar7,pcVar20);
  goto LAB_00245dfb;
LAB_00245e41:
  uVar25 = (ulong)(uint)wVar4;
  goto LAB_00245e01;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}